

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_echo_server.cpp
# Opt level: O1

void __thiscall EchoServer::start(EchoServer *this)

{
  char *pcVar1;
  LogStream *pLVar2;
  char **ppcVar3;
  SourceFile file;
  Logger local_fe0;
  
  if (sznet::g_logLevel < 3) {
    file._8_8_ = 0x13;
    file.m_data = "tcp_echo_server.cpp";
    sznet::Logger::Logger(&local_fe0,file,0x3a);
    if (9 < (uint)(((int)&local_fe0 + 0xfb0) - (int)local_fe0.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_fe0.m_impl.m_stream.m_buffer.m_cur,"starting ",9);
      local_fe0.m_impl.m_stream.m_buffer.m_cur = local_fe0.m_impl.m_stream.m_buffer.m_cur + 9;
    }
    pLVar2 = sznet::LogStream::operator<<(&local_fe0.m_impl.m_stream,numThreads);
    ppcVar3 = &(pLVar2->m_buffer).m_cur;
    pcVar1 = (pLVar2->m_buffer).m_cur;
    if (9 < (uint)((int)ppcVar3 - (int)pcVar1)) {
      builtin_strncpy(pcVar1," threads.",9);
      *ppcVar3 = *ppcVar3 + 9;
    }
    sznet::Logger::~Logger(&local_fe0);
  }
  sznet::net::TcpServer::start(&this->m_server);
  return;
}

Assistant:

void start()
    {
        LOG_INFO << "starting " << numThreads << " threads.";
        m_server.start();
    }